

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-predicate.c
# Opt level: O0

_Bool monster_is_decoyed(monster *mon)

{
  _Bool _Var1;
  loc grid;
  loc_conflict decoy;
  monster *mon_local;
  
  grid = cave_find_decoy(cave);
  _Var1 = loc_is_zero(grid);
  if (_Var1) {
    mon_local._7_1_ = false;
  }
  else {
    _Var1 = los(cave,mon->grid,grid);
    if (_Var1) {
      mon_local._7_1_ = true;
    }
    else {
      mon_local._7_1_ = false;
    }
  }
  return mon_local._7_1_;
}

Assistant:

bool monster_is_decoyed(const struct monster *mon)
{
	struct loc decoy = cave_find_decoy(cave);

	/* No decoy */
	if (loc_is_zero(decoy)) return false;

	/* Monster can't see the decoy */
	if (!los(cave, mon->grid, decoy)) return false;

	return true;
}